

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

path * create_out_folder(path *__return_storage_ptr__,string *st)

{
  bool bVar1;
  Error *this;
  undefined8 uVar2;
  string *st_local;
  path *p;
  
  boost::filesystem::path::path(__return_storage_ptr__,st);
  bVar1 = boost::filesystem::exists(__return_storage_ptr__);
  if ((!bVar1) && (bVar1 = boost::filesystem::create_directory(__return_storage_ptr__), !bVar1)) {
    this = (Error *)__cxa_allocate_exception(0x3f0);
    uVar2 = std::__cxx11::string::operator[]((ulong)st);
    Error::Error(this,"Could not create output dir %s",uVar2);
    __cxa_throw(this,&Error::typeinfo,Error::~Error);
  }
  return __return_storage_ptr__;
}

Assistant:

path create_out_folder(std::string st) {
  path p(st);
  if (!exists(p) && !create_directory(p)) {
    throw Error("Could not create output dir %s", &st[0]);
  }
  return p;
}